

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall PDA::Transducer::Grammar::Rule::addChains<wchar_t[4]>(Rule *this,wchar_t (*t) [4])

{
  allocator<wchar_t> local_59;
  wstring local_58;
  Chain local_38;
  wchar_t (*local_18) [4];
  wchar_t (*t_local) [4];
  Rule *this_local;
  
  local_18 = t;
  t_local = &this->m_left;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_58,*t,&local_59);
  Chain::Chain(&local_38,&local_58);
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  push_back(&this->m_chains,&local_38);
  Chain::~Chain(&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::allocator<wchar_t>::~allocator(&local_59);
  return;
}

Assistant:

void addChains(const T &t)
        {
            m_chains.push_back(Chain(t));
        }